

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall TextEntry::on_key_down(TextEntry *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  char cVar1;
  int iVar2;
  
  iVar2 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar2 != '\0') {
    return;
  }
  switch(event->keycode) {
  case 0x4e:
    this->cursor_pos = 0;
    break;
  case 0x4f:
    iVar2 = al_ustr_size(this->text);
    this->cursor_pos = iVar2;
    break;
  case 0x50:
  case 0x51:
switchD_00108d25_caseD_50:
    if (0x1f < event->unichar) {
      al_ustr_insert_chr(this->text,this->cursor_pos);
      iVar2 = al_utf8_width(event->unichar);
      this->cursor_pos = this->cursor_pos + iVar2;
    }
    break;
  case 0x52:
    al_ustr_prev(this->text,&this->cursor_pos);
    break;
  case 0x53:
    al_ustr_next(this->text,&this->cursor_pos);
    break;
  default:
    if (event->keycode != 0x3f) goto switchD_00108d25_caseD_50;
    cVar1 = al_ustr_prev(this->text,&this->cursor_pos);
    if (cVar1 == '\0') break;
  case 0x4d:
    al_ustr_remove_chr(this->text,this->cursor_pos);
  }
  maybe_scroll(this);
  ((this->super_Widget).dialog)->draw_requested = true;
  return;
}

Assistant:

void TextEntry::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (is_disabled())
      return;

   switch (event.keycode) {
      case ALLEGRO_KEY_LEFT:
         al_ustr_prev(text, &cursor_pos);
         break;

      case ALLEGRO_KEY_RIGHT:
         al_ustr_next(text, &cursor_pos);
         break;

      case ALLEGRO_KEY_HOME:
         cursor_pos = 0;
         break;

      case ALLEGRO_KEY_END:
         cursor_pos = al_ustr_size(text);
         break;

      case ALLEGRO_KEY_DELETE:
         al_ustr_remove_chr(text, cursor_pos);
         break;

      case ALLEGRO_KEY_BACKSPACE:
         if (al_ustr_prev(text, &cursor_pos))
            al_ustr_remove_chr(text, cursor_pos);
         break;

      default:
         if (event.unichar >= ' ') {
            al_ustr_insert_chr(text, cursor_pos, event.unichar);
            cursor_pos += al_utf8_width(event.unichar);
         }
         break;
   }

   maybe_scroll();
   dialog->request_draw();
}